

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractlistview.hpp
# Opt level: O2

void __thiscall
QtMWidgets::AbstractListView<QColor>::rowsRemoved(AbstractListView<QColor> *this,int first,int last)

{
  AbstractListViewPrivate<QColor> *this_00;
  int iVar1;
  int iVar2;
  
  this_00 = (AbstractListViewPrivate<QColor> *)
            (this->super_AbstractListViewBase).super_AbstractScrollArea.d.d;
  if (this_00->firstVisibleRow <= last && first <= this_00->firstVisibleRow) {
    iVar2 = -1;
    if (this_00->model != (ListModel<QColor> *)0x0) {
      iVar1 = (**(code **)(*(long *)&this_00->model->super_AbstractListModel + 0x80))();
      if (iVar1 != 0) {
        iVar2 = first + -1;
        if (first < 1) {
          iVar2 = last + 1;
        }
      }
    }
    this_00->firstVisibleRow = iVar2;
    this_00->offset = 0;
  }
  (**(code **)(*(long *)&(this->super_AbstractListViewBase).super_AbstractScrollArea + 0x1b8))(this)
  ;
  AbstractListViewPrivate<QColor>::updateIfNeeded(this_00,first,last);
  return;
}

Assistant:

void rowsRemoved( int first, int last ) override
	{
		AbstractListViewPrivate< T > * d = d_func();

		if( d->firstVisibleRow >= first && d->firstVisibleRow <= last )
		{
			if( d->model && d->model->rowCount() )
			{
				if( first - 1 >= 0 )
					d->firstVisibleRow = first - 1;
				else
					d->firstVisibleRow = last + 1;

				d->offset = 0;
			}
			else
			{
				d->firstVisibleRow = -1;
				d->offset = 0;
			}
		}

		recalculateSize();

		d->updateIfNeeded( first, last )	;
	}